

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

GLenum toGlStencilOp(StencilOp op)

{
  StencilOp op_local;
  GLenum local_4;
  
  switch(op) {
  case StencilZero:
    local_4 = 0;
    break;
  case Keep:
    local_4 = 0x1e00;
    break;
  case Replace:
    local_4 = 0x1e01;
    break;
  case IncrementAndClamp:
    local_4 = 0x1e02;
    break;
  case DecrementAndClamp:
    local_4 = 0x1e03;
    break;
  case Invert:
    local_4 = 0x150a;
    break;
  case IncrementAndWrap:
    local_4 = 0x8507;
    break;
  case DecrementAndWrap:
    local_4 = 0x8508;
  }
  return local_4;
}

Assistant:

static inline GLenum toGlStencilOp(QRhiGraphicsPipeline::StencilOp op)
{
    switch (op) {
    case QRhiGraphicsPipeline::StencilZero:
        return GL_ZERO;
    case QRhiGraphicsPipeline::Keep:
        return GL_KEEP;
    case QRhiGraphicsPipeline::Replace:
        return GL_REPLACE;
    case QRhiGraphicsPipeline::IncrementAndClamp:
        return GL_INCR;
    case QRhiGraphicsPipeline::DecrementAndClamp:
        return GL_DECR;
    case QRhiGraphicsPipeline::Invert:
        return GL_INVERT;
    case QRhiGraphicsPipeline::IncrementAndWrap:
        return GL_INCR_WRAP;
    case QRhiGraphicsPipeline::DecrementAndWrap:
        return GL_DECR_WRAP;
    default:
        Q_UNREACHABLE_RETURN(GL_KEEP);
    }
}